

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseClassDefinition(ParseContext *ctx)

{
  LexemeType LVar1;
  uint uVar2;
  _func_int **pp_Var3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  SynBase *pSVar7;
  bool bVar8;
  int iVar9;
  SynAlign *pSVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *this_00;
  SynIdentifier *pSVar11;
  Lexeme *pLVar12;
  undefined4 extraout_var_03;
  SynClassElements *pSVar13;
  undefined4 extraout_var_04;
  uint uVar14;
  Lexeme *begin;
  ulong uVar15;
  IntrusiveList<SynIdentifier> aliases;
  TraceScope traceScope;
  IntrusiveList<SynIdentifier> local_88;
  Lexeme *local_70;
  SynAlign *local_68;
  SynBase *local_60;
  TraceScope local_58;
  SynIdentifier *local_48;
  SynIdentifier *pSStack_40;
  SynBase *this;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  pSVar10 = ParseAlign(ctx);
  if (ctx->currentLexeme->type == lex_class) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    bVar8 = anon_unknown.dwarf_16d1cf::CheckAt(ctx,lex_string,"ERROR: class name expected");
    if (bVar8) {
      pLVar12 = ctx->currentLexeme;
      pp_Var3 = (_func_int **)pLVar12->pos;
      uVar14 = pLVar12->length;
      if (pLVar12->type != lex_none) {
        ctx->currentLexeme = pLVar12 + 1;
      }
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynBase *)CONCAT44(extraout_var,iVar9);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002247c0;
      pLVar12 = ctx->currentLexeme + -1;
      SynBase::SynBase(this,4,pLVar12,pLVar12);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
      this[1]._vptr_SynBase = pp_Var3;
      *(ulong *)&this[1].typeID = (long)pp_Var3 + (ulong)uVar14;
    }
    else {
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var_00,iVar9);
      this->typeID = 4;
      this->begin = (Lexeme *)0x0;
      this->end = (Lexeme *)0x0;
      (this->pos).begin = (char *)0x0;
      (this->pos).end = (char *)0x0;
      *(undefined8 *)((long)&(this->pos).end + 2) = 0;
      *(undefined8 *)((long)&this->next + 2) = 0;
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
      this[1]._vptr_SynBase = (_func_int **)0x0;
      *(undefined8 *)&this[1].typeID = 0;
    }
    if (ctx->currentLexeme->type == lex_semicolon) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      if (pSVar10 != (SynAlign *)0x0) {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: can\'t specify alignment of a class prototype");
      }
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar9);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_002247c0:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      SynBase::SynBase(this_00,0x3c,begin,ctx->currentLexeme + -1);
      this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7c08;
      this_00[1]._vptr_SynBase = (_func_int **)this;
    }
    else {
      local_88.head = (SynIdentifier *)0x0;
      local_88.tail = (SynIdentifier *)0x0;
      local_68 = pSVar10;
      if (ctx->currentLexeme->type == lex_less) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        bVar8 = anon_unknown.dwarf_16d1cf::CheckAt
                          (ctx,lex_string,"ERROR: generic type alias required after \'<\'");
        if (bVar8) {
          pLVar12 = ctx->currentLexeme;
          pcVar4 = pLVar12->pos;
          uVar14 = pLVar12->length;
          if (pLVar12->type != lex_none) {
            ctx->currentLexeme = pLVar12 + 1;
          }
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar11 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar9);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002247c0;
          pLVar12 = ctx->currentLexeme + -1;
          SynBase::SynBase((SynBase *)pSVar11,4,pLVar12,pLVar12);
          (pSVar11->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
          (pSVar11->name).begin = pcVar4;
          (pSVar11->name).end = pcVar4 + uVar14;
          IntrusiveList<SynIdentifier>::push_back(&local_88,pSVar11);
          pLVar12 = ctx->currentLexeme;
          if (pLVar12->type == lex_comma) {
            do {
              ctx->currentLexeme = pLVar12 + 1;
              bVar8 = anon_unknown.dwarf_16d1cf::CheckAt
                                (ctx,lex_string,"ERROR: generic type alias required after \',\'");
              if (!bVar8) break;
              pLVar12 = ctx->currentLexeme;
              pcVar4 = pLVar12->pos;
              uVar14 = pLVar12->length;
              if (pLVar12->type != lex_none) {
                ctx->currentLexeme = pLVar12 + 1;
              }
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
              pSVar11 = (SynIdentifier *)CONCAT44(extraout_var_03,iVar9);
              if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002247c0;
              pLVar12 = ctx->currentLexeme + -1;
              SynBase::SynBase((SynBase *)pSVar11,4,pLVar12,pLVar12);
              (pSVar11->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
              (pSVar11->name).begin = pcVar4;
              (pSVar11->name).end = pcVar4 + uVar14;
              IntrusiveList<SynIdentifier>::push_back(&local_88,pSVar11);
              pLVar12 = ctx->currentLexeme;
            } while (pLVar12->type == lex_comma);
          }
        }
        anon_unknown.dwarf_16d1cf::CheckConsume
                  (ctx,lex_greater,"ERROR: \'>\' expected after generic type alias list");
      }
      LVar1 = ctx->currentLexeme->type;
      if (LVar1 == lex_extendable) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
      if (ctx->currentLexeme->type == lex_colon) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        local_60 = ParseType(ctx,(bool *)0x0,false);
        if (local_60 == (SynBase *)0x0) {
          local_60 = (SynBase *)0x0;
          anon_unknown.dwarf_16d1cf::Report
                    (ctx,ctx->currentLexeme,"ERROR: base type name is expected at this point");
        }
      }
      else {
        local_60 = (SynBase *)0x0;
      }
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_ofigure,"ERROR: \'{\' not found after class name");
      if (ParseClassDefinition(ParseContext&)::token == '\0') {
        iVar9 = __cxa_guard_acquire(&ParseClassDefinition(ParseContext&)::token);
        if (iVar9 != 0) {
          ParseClassDefinition::token = NULLC::TraceGetToken("parse","ParseClassBody");
          __cxa_guard_release(&ParseClassDefinition(ParseContext&)::token);
        }
      }
      NULLC::TraceScope::TraceScope(&local_58,ParseClassDefinition::token);
      lVar6 = NULLC::traceContext;
      pp_Var3 = this[1]._vptr_SynBase;
      uVar15 = *(long *)&this[1].typeID - (long)pp_Var3;
      iVar9 = (int)uVar15;
      if (iVar9 != 0) {
        uVar14 = iVar9 + 1;
        if ((*(uint *)(NULLC::traceContext + 0x264) <=
             *(int *)(NULLC::traceContext + 0x260) + uVar14) ||
           (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
          NULLC::TraceDump();
        }
        local_70 = begin;
        if (*(uint *)(lVar6 + 0x264) <= uVar14) {
          __assert_fail("count + 1 < context.labels.max",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
        }
        uVar2 = *(uint *)(lVar6 + 0x260);
        memcpy((void *)((ulong)uVar2 + *(long *)(lVar6 + 0x268)),pp_Var3,uVar15 & 0xffffffff);
        *(undefined1 *)(*(long *)(lVar6 + 0x268) + (ulong)(uint)(*(int *)(lVar6 + 0x260) + iVar9)) =
             0;
        *(int *)(lVar6 + 0x260) = *(int *)(lVar6 + 0x260) + uVar14;
        lVar5 = *(long *)(lVar6 + 0x278);
        uVar14 = *(uint *)(lVar6 + 0x270);
        *(uint *)(lVar6 + 0x270) = uVar14 + 1;
        *(uint *)(lVar5 + (ulong)uVar14 * 8) = uVar2 * 4 + 2;
        *(undefined4 *)(lVar5 + 4 + (ulong)uVar14 * 8) = 0;
        begin = local_70;
      }
      pSVar13 = ParseClassElements(ctx);
      pSVar7 = local_60;
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after class definition");
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
      this_00 = (SynBase *)CONCAT44(extraout_var_04,iVar9);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002247c0;
      local_48 = local_88.head;
      pSStack_40 = local_88.tail;
      SynBase::SynBase(this_00,0x3f,begin,ctx->currentLexeme + -1);
      this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7c40;
      this_00[1]._vptr_SynBase = (_func_int **)local_68;
      *(SynBase **)&this_00[1].typeID = this;
      this_00[1].begin = (Lexeme *)local_48;
      this_00[1].end = (Lexeme *)pSStack_40;
      *(bool *)&this_00[1].pos.begin = LVar1 == lex_extendable;
      this_00[1].pos.end = (char *)pSVar7;
      this_00[1].next = &pSVar13->super_SynBase;
      this_00->field_0x3a = 0;
      NULLC::TraceScope::~TraceScope(&local_58);
    }
  }
  else {
    ctx->currentLexeme = begin;
    this_00 = (SynBase *)0x0;
  }
  return this_00;
}

Assistant:

SynBase* ParseClassDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(ctx.Consume(lex_class))
	{
		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: class name expected"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		if(ctx.Consume(lex_semicolon))
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: can't specify alignment of a class prototype");

			return new (ctx.get<SynClassPrototype>()) SynClassPrototype(start, ctx.Previous(), nameIdentifier);
		}

		IntrusiveList<SynIdentifier> aliases;

		if(ctx.Consume(lex_less))
		{
			if(CheckAt(ctx, lex_string, "ERROR: generic type alias required after '<'"))
			{
				InplaceStr alias = ctx.Consume();

				aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias));

				while(ctx.Consume(lex_comma))
				{
					if(!CheckAt(ctx, lex_string, "ERROR: generic type alias required after ','"))
						break;

					alias = ctx.Consume();

					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias));
				}
			}

			CheckConsume(ctx, lex_greater, "ERROR: '>' expected after generic type alias list");
		}

		bool extendable = ctx.Consume(lex_extendable);

		SynBase *baseClass = NULL;

		if(ctx.Consume(lex_colon))
		{
			baseClass = ParseType(ctx);

			if(!baseClass)
				Report(ctx, ctx.Current(), "ERROR: base type name is expected at this point");
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after class name");

		TRACE_SCOPE("parse", "ParseClassBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		SynClassElements *elements = ParseClassElements(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after class definition");

		return new (ctx.get<SynClassDefinition>()) SynClassDefinition(start, ctx.Previous(), align, nameIdentifier, aliases, extendable, baseClass, elements);
	}

	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}